

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O2

void Abc_NtkCecFraig(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pNtk1_00;
  Abc_Ntk_t *pMiter_00;
  int *piVar2;
  abctime aVar3;
  abctime time;
  abctime time_00;
  Abc_Ntk_t **ppAVar4;
  Abc_Ntk_t *pStr;
  Abc_Ntk_t *pNtk2_00;
  Prove_Params_t *pParams;
  char *pcVar5;
  Abc_Ntk_t *pMiter;
  abctime local_90;
  Prove_Params_t Params;
  
  local_90 = Abc_Clock();
  if (pNtk1->pExdc == (Abc_Ntk_t *)0x0) {
    if (pNtk2->pExdc == (Abc_Ntk_t *)0x0) {
      pNtk2_00 = (Abc_Ntk_t *)0x0;
      goto LAB_002cd250;
    }
    pcVar5 = "First network has no EXDC. Comparing main networks under EXDC of the second network.";
    ppAVar4 = &pNtk2->pExdc;
  }
  else {
    ppAVar4 = &pNtk1->pExdc;
    if (pNtk2->pExdc == (Abc_Ntk_t *)0x0) {
      pcVar5 = 
      "Second network has no EXDC. Comparing main networks under EXDC of the first network.";
    }
    else {
      puts("Comparing EXDC of the two networks:");
      Abc_NtkCecFraig(*ppAVar4,pNtk2->pExdc,nSeconds,fVerbose);
      pcVar5 = "Comparing networks under EXDC of the first network.";
    }
  }
  puts(pcVar5);
  pNtk2_00 = *ppAVar4;
LAB_002cd250:
  pStr = pNtk2;
  pNtk1_00 = Abc_NtkMiter(pNtk1,pNtk2,1,0,0,0);
  pMiter = pNtk1_00;
  if (pNtk1_00 == (Abc_Ntk_t *)0x0) {
    puts("Miter computation has failed.");
    return;
  }
  pMiter_00 = pNtk1_00;
  if (pNtk2_00 != (Abc_Ntk_t *)0x0) {
    if (pNtk1_00->vPos->nSize != 1) {
      __assert_fail("Abc_NtkPoNum(pMiter) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                    ,0xa5,"void Abc_NtkCecFraig(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
    }
    if (pNtk2_00->vPos->nSize != 1) {
      __assert_fail("Abc_NtkPoNum(pExdc) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                    ,0xa6,"void Abc_NtkCecFraig(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
    }
    pMiter_00 = Abc_NtkMiter(pNtk1_00,pNtk2_00,1,0,1,0);
    pMiter = pMiter_00;
    Abc_NtkDelete(pNtk1_00);
    pStr = pNtk2_00;
  }
  iVar1 = Abc_NtkMiterIsConstant(pMiter_00);
  if (iVar1 == 1) {
    printf("Networks are equivalent after structural hashing.  ");
  }
  else {
    if (iVar1 != 0) {
      pParams = &Params;
      Prove_ParamsSetDefault(pParams);
      Params.nItersMax = 5;
      iVar1 = Abc_NtkIvyProve(&pMiter,pParams);
      if (iVar1 == 0) {
        pParams = (Prove_Params_t *)pMiter->pModel;
        piVar2 = Abc_NtkVerifySimulatePattern(pMiter,(int *)pParams);
        if (*piVar2 == 1) {
          printf("Networks are NOT EQUIVALENT.  ");
        }
        else {
          puts("ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.");
        }
        free(piVar2);
      }
      else {
        if (iVar1 == -1) {
          pcVar5 = "Networks are undecided (resource limits is reached).  ";
        }
        else {
          pcVar5 = "Networks are equivalent.  ";
        }
        printf(pcVar5);
      }
      aVar3 = Abc_Clock();
      Abc_PrintTime((int)aVar3 - (int)local_90,(char *)pParams,time_00);
      if (pMiter->pModel != (int *)0x0) {
        Abc_NtkVerifyReportError(pNtk1,pNtk2,pMiter->pModel);
      }
      Abc_NtkDelete(pMiter);
      return;
    }
    printf("Networks are NOT EQUIVALENT after structural hashing.  ");
    piVar2 = Abc_NtkVerifyGetCleanModel(pMiter_00,1);
    pMiter_00->pModel = piVar2;
    Abc_NtkVerifyReportError(pNtk1,pNtk2,piVar2);
    pStr = pNtk2;
    if (pMiter_00->pModel != (int *)0x0) {
      free(pMiter_00->pModel);
      pMiter_00->pModel = (int *)0x0;
      pStr = pNtk2;
    }
  }
  Abc_NtkDelete(pMiter_00);
  aVar3 = Abc_Clock();
  Abc_PrintTime((int)aVar3 - (int)local_90,(char *)pStr,time);
  return;
}

Assistant:

void Abc_NtkCecFraig( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose )
{
    abctime clk = Abc_Clock();
    Prove_Params_t Params, * pParams = &Params;
//    Fraig_Params_t Params;
//    Fraig_Man_t * pMan;
    Abc_Ntk_t * pMiter, * pTemp;
    Abc_Ntk_t * pExdc = NULL;
    int RetValue;

    if ( pNtk1->pExdc != NULL || pNtk2->pExdc != NULL )
    {
        if ( pNtk1->pExdc != NULL && pNtk2->pExdc != NULL )
        {
            printf( "Comparing EXDC of the two networks:\n" );
            Abc_NtkCecFraig( pNtk1->pExdc, pNtk2->pExdc, nSeconds, fVerbose );
            printf( "Comparing networks under EXDC of the first network.\n" );
            pExdc = pNtk1->pExdc;
        }
        else if ( pNtk1->pExdc != NULL )
        {
            printf( "Second network has no EXDC. Comparing main networks under EXDC of the first network.\n" );
            pExdc = pNtk1->pExdc;
        }
        else if ( pNtk2->pExdc != NULL ) 
        {
            printf( "First network has no EXDC. Comparing main networks under EXDC of the second network.\n" );
            pExdc = pNtk2->pExdc;
        }
        else assert( 0 );
    }

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    // add EXDC to the miter
    if ( pExdc )
    {
        assert( Abc_NtkPoNum(pMiter) == 1 );
        assert( Abc_NtkPoNum(pExdc) == 1 );
        pMiter = Abc_NtkMiter( pTemp = pMiter, pExdc, 1, 0, 1, 0 );
        Abc_NtkDelete( pTemp );
    }
    // handle trivial case
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.  " );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        return;
    }
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent after structural hashing.  " );
        Abc_NtkDelete( pMiter );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        return;
    }
/*
    // convert the miter into a FRAIG
    Fraig_ParamsSetDefault( &Params );
    Params.fVerbose = fVerbose;
    Params.nSeconds = nSeconds;
//    Params.fFuncRed = 0;
//    Params.nPatsRand = 0;
//    Params.nPatsDyna = 0;
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pMiter, &Params, 0, 0 ); 
    Fraig_ManProveMiter( pMan );

    // analyze the result
    RetValue = Fraig_ManCheckMiter( pMan );
    // report the result
    if ( RetValue == -1 )
        printf( "Networks are undecided (SAT solver timed out on the final miter).\n" );
    else if ( RetValue == 1 )
        printf( "Networks are equivalent after fraiging.\n" );
    else if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after fraiging.\n" );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, Fraig_ManReadModel(pMan) );
    }
    else assert( 0 );
    // delete the fraig manager
    Fraig_ManFree( pMan );
    // delete the miter
    Abc_NtkDelete( pMiter );
*/
    // solve the CNF using the SAT solver
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 5;
//    RetValue = Abc_NtkMiterProve( &pMiter, pParams );
//    pParams->fVerbose = 1;
    RetValue = Abc_NtkIvyProve( &pMiter, pParams );
    if ( RetValue == -1 )
        printf( "Networks are undecided (resource limits is reached).  " );
    else if ( RetValue == 0 )
    {
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiter, pMiter->pModel );
        if ( pSimInfo[0] != 1 )
            printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
        else
            printf( "Networks are NOT EQUIVALENT.  " );
        ABC_FREE( pSimInfo );
    }
    else
        printf( "Networks are equivalent.  " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( pMiter->pModel )
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
    Abc_NtkDelete( pMiter );
}